

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_ManSimPatHashPatterns(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int *pnC0,int *pnC1)

{
  int iVar1;
  Vec_Mem_t *p_00;
  word *pIn1;
  bool bVar2;
  word *pSim;
  Vec_Mem_t *vStore;
  int nUnique;
  int i;
  Gia_Obj_t *pObj;
  int *pnC1_local;
  int *pnC0_local;
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_MemAlloc(nWords,0xc);
  Vec_MemHashAlloc(p_00,0x1000);
  vStore._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (vStore._4_4_ < p->nObjs) {
      _nUnique = Gia_ManObj(p,vStore._4_4_);
      bVar2 = _nUnique != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsCand(_nUnique);
    if (iVar1 != 0) {
      pIn1 = Vec_WrdEntryP(vSims,vStore._4_4_ * nWords);
      if ((pnC0 != (int *)0x0) && (iVar1 = Abc_TtIsConst0(pIn1,nWords), iVar1 != 0)) {
        *pnC0 = *pnC0 + 1;
      }
      if ((pnC1 != (int *)0x0) && (iVar1 = Abc_TtIsConst1(pIn1,nWords), iVar1 != 0)) {
        *pnC1 = *pnC1 + 1;
      }
      Vec_MemHashInsert(p_00,pIn1);
    }
    vStore._4_4_ = vStore._4_4_ + 1;
  }
  iVar1 = Vec_MemEntryNum(p_00);
  Vec_MemHashFree(p_00);
  Vec_MemFree(p_00);
  return iVar1;
}

Assistant:

int Gia_ManSimPatHashPatterns( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int * pnC0, int * pnC1 )
{
    Gia_Obj_t * pObj; 
    int i, nUnique;
    Vec_Mem_t * vStore;
    vStore = Vec_MemAlloc( nWords, 12 ); // 2^12 N-word entries per page
    Vec_MemHashAlloc( vStore, 1 << 12 );
    Gia_ManForEachCand( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( pnC0 && Abc_TtIsConst0(pSim, nWords) )
            (*pnC0)++;
        if ( pnC1 && Abc_TtIsConst1(pSim, nWords) )
            (*pnC1)++;
        Vec_MemHashInsert( vStore, pSim );
    }
    nUnique = Vec_MemEntryNum( vStore );
    Vec_MemHashFree( vStore );
    Vec_MemFree( vStore );
    return nUnique;
}